

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiPiece.cpp
# Opt level: O3

set<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::allocator<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>
* MultiPiece::get_plays
            (set<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::allocator<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>
             *__return_storage_ptr__,Board *board,Color color,uint turn,bool threatening)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *__last;
  _Rb_tree_header *p_Var2;
  _Rb_tree_impl<std::less<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_true>
  *p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_color _Var5;
  _Base_ptr p_Var6;
  undefined7 in_register_00000081;
  set<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::allocator<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>
  plays;
  _Rb_tree<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::_Identity<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::less<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::allocator<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>
  local_c0;
  _Rb_tree<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::_Identity<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::less<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::allocator<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>
  local_90;
  _Rb_tree<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::_Identity<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::less<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::allocator<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  __last = &local_c0._M_impl.super__Rb_tree_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left = &__last->_M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right = &__last->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if ((int)CONCAT71(in_register_00000081,threatening) == 0) {
    get_castling((set<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::allocator<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>
                  *)&local_90,board,color,turn);
    std::
    _Rb_tree<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::_Identity<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::less<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::allocator<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>
    ::clear(&local_c0);
    if (local_90._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var2 = &local_90._M_impl.super__Rb_tree_header;
      local_c0._M_impl.super__Rb_tree_header._M_header._M_color =
           local_90._M_impl.super__Rb_tree_header._M_header._M_color;
      local_c0._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
           local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_90._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_90._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &__last->_M_header;
      local_c0._M_impl.super__Rb_tree_header._M_node_count =
           local_90._M_impl.super__Rb_tree_header._M_node_count;
      local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      local_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    }
    std::
    _Rb_tree<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::_Identity<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::less<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::allocator<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>
    ::~_Rb_tree(&local_90);
    std::
    _Rb_tree<std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::_Identity<std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>,std::less<std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>,std::allocator<std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>
    ::
    _M_insert_range_unique<std::_Rb_tree_const_iterator<std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>
              ((_Rb_tree<std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::_Identity<std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>,std::less<std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>,std::allocator<std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>
                *)&local_60,
               (_Rb_tree_const_iterator<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>
                )local_c0._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>
                )__last);
  }
  get_en_passant((set<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::allocator<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>
                  *)&local_90,board,color,turn);
  std::
  _Rb_tree<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::_Identity<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::less<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::allocator<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>
  ::clear(&local_c0);
  if (local_90._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &local_90._M_impl.super__Rb_tree_header;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_color =
         local_90._M_impl.super__Rb_tree_header._M_header._M_color;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_90._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_90._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &__last->_M_header;
    local_c0._M_impl.super__Rb_tree_header._M_node_count =
         local_90._M_impl.super__Rb_tree_header._M_node_count;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::_Identity<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::less<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::allocator<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::_Identity<std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>,std::less<std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>,std::allocator<std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>
  ::
  _M_insert_range_unique<std::_Rb_tree_const_iterator<std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>
            ((_Rb_tree<std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::_Identity<std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>,std::less<std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>,std::allocator<std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>
              *)&local_60,
             (_Rb_tree_const_iterator<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>
              )local_c0._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>
              )__last);
  p_Var4 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    p_Var3 = &(__return_storage_ptr__->_M_t)._M_impl;
    _Var5 = _S_red;
    p_Var6 = p_Var4;
  }
  else {
    p_Var3 = &local_60._M_impl;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    (local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var4;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
         local_60._M_impl.super__Rb_tree_header._M_node_count;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_right;
    _Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_color;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = p_Var4;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = p_Var6;
  (p_Var3->super__Rb_tree_header)._M_node_count = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _Var5;
  std::
  _Rb_tree<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::_Identity<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::less<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::allocator<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::_Identity<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::less<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>,_std::allocator<std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

set<play> MultiPiece::get_plays(const Board &board, Color color, unsigned int turn, bool threatening) {
    set<play> plays, other;

    // Skip castling moves if only searching for threatening play moves.
    if (!threatening) {
        // Get castling play moves.
        other = get_castling(board, color, turn);
        plays.insert(other.begin(), other.end());
    }

    // Get en passant play moves.
    other = get_en_passant(board, color, turn);
    plays.insert(other.begin(), other.end());

    return move(plays);
}